

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareSourceTexture
          (FunctionalTest *this,GLenum internal_format,bool is_stencil,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *texture_data)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  GLenum type;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  type = 0x84fa;
  if (internal_format != 0x88f0) {
    if (internal_format != 0x8cad) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                 ,0x3c2);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    type = 0x8dad;
  }
  GVar2 = Utils::createAndFill2DTexture
                    ((this->super_TestCase).m_context,8,8,internal_format,0x84f9,type,
                     (texture_data->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  (**(code **)(lVar4 + 0xb8))(0xde1,GVar2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x3cc);
  if (is_stencil) {
    (**(code **)(lVar4 + 0x1360))(0xde1,0x90ea,0x1901);
    iVar1 = 0x3d1;
  }
  else {
    (**(code **)(lVar4 + 0x1360))(0xde1,0x90ea,0x1902);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x884c,0);
    iVar1 = 0x3d7;
  }
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"TexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,iVar1);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2600);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"TexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x3dd);
  (**(code **)(lVar4 + 0xb8))(0xde1,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x3e1);
  return GVar2;
}

Assistant:

GLuint FunctionalTest::prepareSourceTexture(GLenum internal_format, bool is_stencil,
											const std::vector<glw::GLubyte>& texture_data)
{
	const Functions& gl			= m_context.getRenderContext().getFunctions();
	GLuint			 texture_id = 0;
	GLenum			 type		= 0;

	/* Select size of pixel */
	switch (internal_format)
	{
	case GL_DEPTH24_STENCIL8:
		type = GL_UNSIGNED_INT_24_8;
		break;
	case GL_DEPTH32F_STENCIL8:
		type = GL_FLOAT_32_UNSIGNED_INT_24_8_REV;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Create texture */
	texture_id = Utils::createAndFill2DTexture(m_context, m_width, m_height, internal_format, GL_DEPTH_STENCIL, type,
											   &texture_data[0]);

	/* Set DS texture mode */
	gl.bindTexture(GL_TEXTURE_2D, texture_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	if (true == is_stencil)
	{
		gl.texParameteri(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, GL_STENCIL_INDEX);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
	}
	else
	{
		gl.texParameteri(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, GL_DEPTH_COMPONENT);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_NONE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
	}

	/* Set nearest filtering */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

	/* Unbind */
	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Done */
	return texture_id;
}